

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O2

void __thiscall CGL::OSDText::OSDText(OSDText *this)

{
  FT_Library *ppFVar1;
  FT_Face_conflict *ppFVar2;
  vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_> local_38;
  
  (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->use_hdpi = false;
  ppFVar1 = (FT_Library *)operator_new(8);
  this->ft = ppFVar1;
  ppFVar2 = (FT_Face_conflict *)operator_new(8);
  this->face = ppFVar2;
  local_38.super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::_M_move_assign(&this->lines,&local_38);
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::~vector(&local_38);
  this->next_id = 0;
  return;
}

Assistant:

OSDText::OSDText() {

  use_hdpi = false;

  ft   = new FT_Library;
  face = new FT_Face;

  lines = vector<OSDLine>(); next_id = 0;
}